

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

int __thiscall BufferedReader::createReader(BufferedReader *this,int readBuffOffset)

{
  int iVar1;
  undefined4 extraout_var;
  mapped_type *ppRVar3;
  int newReaderID;
  key_type_conflict local_24;
  mapped_type pRVar2;
  
  iVar1 = (*(this->super_AbstractReader)._vptr_AbstractReader[0xe])();
  pRVar2 = (mapped_type)CONCAT44(extraout_var,iVar1);
  pRVar2->m_blockSize = (this->super_AbstractReader).m_blockSize;
  pRVar2->m_allocSize = (this->super_AbstractReader).m_allocSize;
  pRVar2->m_readOffset = readBuffOffset;
  pRVar2->m_firstBlock = true;
  pRVar2->m_lastBlock = false;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar1 == 0) {
    iVar1 = createNewReaderID();
    ppRVar3 = std::
              map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
              ::operator[](&this->m_readers,&local_24);
    *ppRVar3 = pRVar2;
    if (this->m_started == false) {
      TerminatableThread::run(&this->super_TerminatableThread);
      this->m_started = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int BufferedReader::createReader(const int readBuffOffset)
{
    ReaderData* data = intCreateReader();

    data->m_blockSize = m_blockSize;
    data->m_allocSize = m_allocSize;

    data->m_readOffset = readBuffOffset;

    data->m_firstBlock = true;
    data->m_lastBlock = false;

    std::lock_guard lock(m_readersMtx);
    const int newReaderID = createNewReaderID();
    m_readers[newReaderID] = data;
    size_t rSize = m_readers.size();
    if (!m_started)
    {
        run(this);
        m_started = true;
    }
    LTRACE(LT_INFO, 0, "Reader #" << m_id << ". Start new stream " << newReaderID << ". stream(s): " << rSize);

    return newReaderID;
}